

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QByteArray>::reserve(QList<QByteArray> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<QByteArray> *pQVar3;
  qsizetype qVar4;
  QByteArray *b;
  Data *pDVar5;
  long in_RSI;
  QArrayDataPointer<QByteArray> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QByteArray> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QByteArray> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QByteArray> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QGenericArrayOps<QByteArray> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QByteArray> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QArrayDataPointer<QByteArray> *)capacity((QList<QByteArray> *)0x10a19f);
  qVar4 = QArrayDataPointer<QByteArray>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)pQVar3 - qVar4) {
    QArrayDataPointer<QByteArray>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QByteArray>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_0010a342;
    QArrayDataPointer<QByteArray>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QByteArray>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QByteArray>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QByteArray>::setFlag
                ((QArrayDataPointer<QByteArray> *)0x10a246,(ArrayOptions)f.i);
      goto LAB_0010a342;
    }
  }
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
  local_38.size = -0x5555555555555556;
  local_40 = size((QList<QByteArray> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QByteArray>::QArrayDataPointer
            (pQVar3,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  pQVar3 = (QArrayDataPointer<QByteArray> *)QArrayDataPointer<QByteArray>::operator->(&local_38);
  QArrayDataPointer<QByteArray>::operator->(in_RDI);
  b = QArrayDataPointer<QByteArray>::begin((QArrayDataPointer<QByteArray> *)0x10a2c6);
  QArrayDataPointer<QByteArray>::operator->(in_RDI);
  QArrayDataPointer<QByteArray>::end(pQVar3);
  QtPrivate::QGenericArrayOps<QByteArray>::copyAppend
            (in_stack_ffffffffffffff90,b,(QByteArray *)pQVar3);
  pDVar5 = QArrayDataPointer<QByteArray>::d_ptr(&local_38);
  if (pDVar5 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QByteArray> *)QArrayDataPointer<QByteArray>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)pQVar3,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QByteArray>::setFlag
              ((QArrayDataPointer<QByteArray> *)0x10a329,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QByteArray>::swap(pQVar3,in_stack_ffffffffffffff78);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(pQVar3);
LAB_0010a342:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}